

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O3

void light_pcapng_historgram
               (light_pcapng pcapng,_func_uint32_t_light_pcapng *key_master,light_pair **hist,
               size_t *size,size_t *rejected)

{
  uint32_t uVar1;
  size_t sVar2;
  light_pair *plVar3;
  size_t sVar4;
  size_t local_48;
  
  *hist = (light_pair *)0x0;
  if (pcapng == (light_pcapng)0x0) {
    local_48 = 0;
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    local_48 = 0;
    do {
      uVar1 = (*key_master)(pcapng);
      if (uVar1 == 0xffffffff) {
        local_48 = local_48 + 1;
      }
      else {
        plVar3 = *hist;
        if (sVar4 != 0) {
          sVar2 = 0;
          do {
            if (plVar3[sVar2].key == uVar1) {
              plVar3[sVar2].val = plVar3[sVar2].val + 1;
              goto LAB_00101d1a;
            }
            sVar2 = sVar2 + 1;
          } while (sVar4 != sVar2);
        }
        plVar3 = (light_pair *)realloc(plVar3,sVar4 * 8 + 8);
        *hist = plVar3;
        plVar3[sVar4].key = uVar1;
        plVar3[sVar4].val = 1;
        sVar4 = sVar4 + 1;
      }
LAB_00101d1a:
      pcapng = pcapng->next_block;
    } while (pcapng != (_light_pcapng *)0x0);
  }
  *size = sVar4;
  if (rejected != (size_t *)0x0) {
    *rejected = local_48;
  }
  return;
}

Assistant:

void light_pcapng_historgram(const light_pcapng pcapng, uint32_t (*key_master)(const light_pcapng),
		light_pair **hist, size_t *size, size_t *rejected)
{
	light_pcapng iterator = pcapng;
	size_t dropped = 0;
	size_t sz = 0;
	size_t i;

	*hist = NULL;

	while (iterator != NULL) {
		uint32_t key = key_master(iterator);
		if (key != LIGHT_KEY_REJECTED) {
			int found = 0;
			for (i = 0; i < sz; ++i) {
				if ((*hist)[i].key == key) {
					found = 1;
					(*hist)[i].val++;
					break;
				}
			}

			if (found == 0) {
				*hist = realloc(*hist, (sz + 1) * sizeof(light_pair));
				(*hist)[sz].key = key;
				(*hist)[sz].val = 1;
				sz++;
			}
		}
		else {
			dropped++;
		}
		iterator = iterator->next_block;
	}

	*size = sz;

	if (rejected != NULL)
		*rejected = dropped;
}